

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  ImGuiTableSortSpecs *pIVar1;
  int iVar2;
  ImGuiTable *pIVar3;
  ImGuiID IVar4;
  ImGuiTable *pIVar5;
  
  iVar2 = this->FreeIdx;
  if (iVar2 == (this->Buf).Size) {
    ImVector<ImGuiTable>::resize(&this->Buf,iVar2 + 1);
    IVar4 = this->FreeIdx + 1;
    pIVar5 = (this->Buf).Data;
  }
  else {
    pIVar5 = (this->Buf).Data;
    IVar4 = pIVar5[iVar2].ID;
  }
  this->FreeIdx = IVar4;
  *(undefined4 *)&pIVar5[iVar2].SortSpecsSingle.field_0x8 = 0;
  pIVar3 = pIVar5 + iVar2;
  (pIVar3->SortSpecsSingle).ColumnUserID = 0;
  (pIVar3->SortSpecsSingle).ColumnIndex = 0;
  (pIVar3->SortSpecsSingle).SortOrder = 0;
  pIVar1 = &pIVar5[iVar2].SortSpecs;
  pIVar1->Specs = (ImGuiTableColumnSortSpecs *)0x0;
  pIVar1->SpecsCount = 0;
  pIVar1->SpecsDirty = false;
  *(undefined3 *)&pIVar1->field_0xd = 0;
  memset(pIVar5 + iVar2,0,0x218);
  pIVar5[iVar2].LastFrameActive = -1;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }